

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall sector_t::FindShortestTextureAround(sector_t *this)

{
  line_t_conflict *plVar1;
  FTexture *pFVar2;
  FTextureID FVar3;
  long lVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  
  if (0 < (long)this->linecount) {
    dVar6 = 3.4028234663852886e+38;
    lVar4 = 0;
    do {
      plVar1 = this->lines[lVar4];
      if ((plVar1->flags & 4) != 0) {
        uVar5 = plVar1->sidedef[0]->textures[2].texture.texnum;
        if ((long)(int)uVar5 < 1) {
          if (((i_compatflags & 1U) != 0 && TexMan.Textures.Count != 0) && uVar5 == 0)
          goto LAB_004433b1;
        }
        else if (uVar5 < TexMan.Textures.Count) {
LAB_004433b1:
          pFVar2 = TexMan.Textures.Array[(int)uVar5].Texture;
          if ((pFVar2 != (FTexture *)0x0) &&
             (uVar5 = (uint)((double)((uint)pFVar2->Height * 2) / (pFVar2->Scale).Y),
             dVar7 = (double)(int)((uVar5 & 1) + ((int)uVar5 >> 1)), dVar7 < dVar6)) {
            dVar6 = dVar7;
          }
        }
        uVar5 = plVar1->sidedef[1]->textures[2].texture.texnum;
        if ((long)(int)uVar5 < 1) {
          if (((i_compatflags & 1U) != 0 && TexMan.Textures.Count != 0) && uVar5 == 0)
          goto LAB_0044342a;
        }
        else if (uVar5 < TexMan.Textures.Count) {
LAB_0044342a:
          pFVar2 = TexMan.Textures.Array[(int)uVar5].Texture;
          if ((pFVar2 != (FTexture *)0x0) &&
             (uVar5 = (uint)((double)((uint)pFVar2->Height * 2) / (pFVar2->Scale).Y),
             dVar7 = (double)(int)((uVar5 & 1) + ((int)uVar5 >> 1)), dVar7 < dVar6)) {
            dVar6 = dVar7;
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (this->linecount != lVar4);
    if (dVar6 < 3.4028234663852886e+38) {
      return dVar6;
    }
  }
  FVar3 = FTextureManager::GetTexture(&TexMan,(char *)0x0,8,0);
  return (double)(TexMan.Textures.Array[(uint)FVar3.texnum].Texture)->Height;
}

Assistant:

double sector_t::FindShortestTextureAround () const
{
	double minsize = FLT_MAX;

	for (int i = 0; i < linecount; i++)
	{
		if (lines[i]->flags & ML_TWOSIDED)
		{
			CheckShortestTex (lines[i]->sidedef[0]->GetTexture(side_t::bottom), minsize);
			CheckShortestTex (lines[i]->sidedef[1]->GetTexture(side_t::bottom), minsize);
		}
	}
	return minsize < FLT_MAX ? minsize : TexMan[0]->GetHeight();
}